

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

boolean qt_fill_input_buffer(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  QByteArray *pQVar5;
  qsizetype qVar6;
  long in_RDI;
  qint64 num_read;
  my_jpeg_source_mgr *src;
  long local_18;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x28);
  if (puVar1[0x208] == 0) {
    *puVar1 = puVar1 + 8;
    local_18 = QIODevice::read((char *)puVar1[7],(longlong)(puVar1 + 8));
  }
  else {
    QBuffer::data();
    pcVar3 = QByteArray::constData((QByteArray *)0x109730);
    lVar4 = (**(code **)(*(long *)puVar1[0x208] + 0x78))();
    *puVar1 = pcVar3 + lVar4;
    pQVar5 = (QByteArray *)QBuffer::data();
    qVar6 = QByteArray::size(pQVar5);
    local_18 = (**(code **)(*(long *)puVar1[0x208] + 0x78))();
    local_18 = qVar6 - local_18;
    plVar2 = (long *)puVar1[7];
    pQVar5 = (QByteArray *)QBuffer::data();
    qVar6 = QByteArray::size(pQVar5);
    (**(code **)(*plVar2 + 0x88))(plVar2,qVar6);
  }
  if (local_18 < 1) {
    *puVar1 = puVar1 + 8;
    *(undefined1 *)(puVar1 + 8) = 0xff;
    *(undefined1 *)((long)puVar1 + 0x41) = 0xd9;
    puVar1[1] = 2;
  }
  else {
    puVar1[1] = local_18;
  }
  return 1;
}

Assistant:

static boolean qt_fill_input_buffer(j_decompress_ptr cinfo)
{
    my_jpeg_source_mgr* src = (my_jpeg_source_mgr*)cinfo->src;
    qint64 num_read = 0;
    if (src->memDevice) {
        src->next_input_byte = (const JOCTET *)(src->memDevice->data().constData() + src->memDevice->pos());
        num_read = src->memDevice->data().size() - src->memDevice->pos();
        src->device->seek(src->memDevice->data().size());
    } else {
        src->next_input_byte = src->buffer;
        num_read = src->device->read((char*)src->buffer, max_buf);
    }
    if (num_read <= 0) {
        // Insert a fake EOI marker - as per jpeglib recommendation
        src->next_input_byte = src->buffer;
        src->buffer[0] = (JOCTET) 0xFF;
        src->buffer[1] = (JOCTET) JPEG_EOI;
        src->bytes_in_buffer = 2;
    } else {
        src->bytes_in_buffer = num_read;
    }
    return TRUE;
}